

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall
GslSpan_FromPointerPointerConstructor_Test::TestBody
          (GslSpan_FromPointerPointerConstructor_Test *this)

{
  pointer *ppeVar1;
  bool bVar2;
  char *pcVar3;
  reference peVar4;
  reference peVar5;
  AssertHelper local_520;
  Message local_518;
  void *local_510;
  pointer local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_23;
  Message local_4e8;
  int local_4dc;
  index_type local_4d8;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_22;
  span<int,__1L> s_8;
  int *p_2;
  Message local_4a0;
  pointer *local_498;
  pointer local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_21;
  Message local_470;
  int local_464;
  index_type local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_20;
  span<int,__1L> s_7;
  Message local_430;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_19;
  Message local_408;
  int local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_18;
  Message local_3e0;
  pointer *local_3d8;
  pointer local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_17;
  AssertHelper local_3b0;
  Message local_3a8;
  int local_39c;
  index_type local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_16;
  span<int,__1L> s_6;
  Message local_368;
  void *local_360;
  pointer local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_15;
  Message local_338;
  int local_32c;
  index_type local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_14;
  span<int,_0L> s_5;
  int *p_1;
  Message local_2f8;
  void *local_2f0;
  pointer local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_13;
  Message local_2c8;
  int local_2bc;
  index_type local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_12;
  span<int,__1L> s_4;
  int *p;
  Message local_280;
  pointer *local_278;
  pointer local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_11;
  Message local_250;
  int local_244;
  index_type local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_10;
  span<int,_0L> s_3;
  Message local_218;
  pointer *local_210;
  pointer local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_9;
  Message local_1e8;
  int local_1dc;
  index_type local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_8;
  span<int,__1L> s_2;
  Message local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_7;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_6;
  Message local_158;
  pointer *local_150;
  pointer local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_5;
  Message local_128;
  int local_11c;
  index_type local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_4;
  span<int,_2L> s_1;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  pointer *local_98;
  pointer local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  int local_54;
  index_type local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  span<int,__1L> s;
  int arr [4];
  GslSpan_FromPointerPointerConstructor_Test *this_local;
  
  s.storage_.data_ = (pointer)0x200000001;
  arr[0] = 3;
  arr[1] = 4;
  pstore::gsl::span<int,_-1L>::span
            ((span<int,__1L> *)&gtest_ar.message_,(pointer)&s.storage_.data_,arr);
  local_50 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar.message_);
  local_54 = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_48,"s.length ()","2",&local_50,&local_54);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar2) {
    testing::Message::Message(local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  local_90 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar.message_);
  local_98 = &s.storage_.data_;
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_88,"s.data ()","&arr[0]",&local_90,(int **)&local_98);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xdd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  peVar4 = pstore::gsl::span<int,_-1L>::operator[]((span<int,__1L> *)&gtest_ar.message_,0);
  local_bc = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_b8,"s[0]","1",peVar4,&local_bc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar2) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  peVar4 = pstore::gsl::span<int,_-1L>::operator[]((span<int,__1L> *)&gtest_ar.message_,1);
  local_e4 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e0,"s[1]","2",peVar4,&local_e4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar2) {
    testing::Message::Message(&local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xdf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_1,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_1);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  pstore::gsl::span<int,_2L>::span
            ((span<int,_2L> *)&gtest_ar_4.message_,(pointer)&s.storage_.data_,arr);
  local_118 = pstore::gsl::span<int,_2L>::length((span<int,_2L> *)&gtest_ar_4.message_);
  local_11c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_110,"s.length ()","2",&local_118,&local_11c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_148 = pstore::gsl::span<int,_2L>::data((span<int,_2L> *)&gtest_ar_4.message_);
  local_150 = &s.storage_.data_;
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_140,"s.data ()","&arr[0]",&local_148,(int **)&local_150);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xe4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  peVar5 = pstore::gsl::span<int,_2L>::operator[]((span<int,_2L> *)&gtest_ar_4.message_,0);
  local_174 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_170,"s[0]","1",peVar5,&local_174);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  peVar5 = pstore::gsl::span<int,_2L>::operator[]((span<int,_2L> *)&gtest_ar_4.message_,1);
  local_19c = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_198,"s[1]","2",peVar5,&local_19c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_2.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_2.storage_.data_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_2.storage_.data_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  ppeVar1 = &s.storage_.data_;
  pstore::gsl::span<int,_-1L>::span
            ((span<int,__1L> *)&gtest_ar_8.message_,(pointer)ppeVar1,(pointer)ppeVar1);
  local_1d8 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar_8.message_);
  local_1dc = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1d0,"s.length ()","0",&local_1d8,&local_1dc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_208 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar_8.message_);
  local_210 = &s.storage_.data_;
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_200,"s.data ()","&arr[0]",&local_208,(int **)&local_210);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar2) {
    testing::Message::Message(&local_218);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_3,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_3);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  ppeVar1 = &s.storage_.data_;
  pstore::gsl::span<int,_0L>::span
            ((span<int,_0L> *)&gtest_ar_10.message_,(pointer)ppeVar1,(pointer)ppeVar1);
  local_240 = pstore::gsl::span<int,_0L>::length((span<int,_0L> *)&gtest_ar_10.message_);
  local_244 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_238,"s.length ()","0",&local_240,&local_244);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar2) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_270 = pstore::gsl::span<int,_0L>::data((span<int,_0L> *)&gtest_ar_10.message_);
  local_278 = &s.storage_.data_;
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_268,"s.data ()","&arr[0]",&local_270,(int **)&local_278);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar2) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  pstore::gsl::span<int,_-1L>::span
            ((span<int,__1L> *)&gtest_ar_12.message_,(pointer)0x0,(pointer)0x0);
  local_2b8 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar_12.message_);
  local_2bc = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2b0,"s.length ()","0",&local_2b8,&local_2bc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xf6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_2c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_2e8 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar_12.message_);
  local_2f0 = (void *)0x0;
  testing::internal::EqHelper::Compare<int_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_2e0,"s.data ()","nullptr",&local_2e8,&local_2f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar2) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p_1,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p_1);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  pstore::gsl::span<int,_0L>::span((span<int,_0L> *)&gtest_ar_14.message_,(pointer)0x0,(pointer)0x0)
  ;
  local_328 = pstore::gsl::span<int,_0L>::length((span<int,_0L> *)&gtest_ar_14.message_);
  local_32c = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_320,"s.length ()","0",&local_328,&local_32c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar2) {
    testing::Message::Message(&local_338);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xfc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_358 = pstore::gsl::span<int,_0L>::data((span<int,_0L> *)&gtest_ar_14.message_);
  local_360 = (void *)0x0;
  testing::internal::EqHelper::Compare<int_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_350,"s.data ()","nullptr",&local_358,&local_360);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar2) {
    testing::Message::Message(&local_368);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_6.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0xfd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_6.storage_.data_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_6.storage_.data_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  join_0x00000010_0x00000000_ =
       (storage_type<pstore::gsl::details::extent_type<_1L>_>)
       pstore::gsl::make_span<int>((int *)&s.storage_.data_,arr);
  local_398 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar_16.message_);
  local_39c = 2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_390,"s.length ()","2",&local_398,&local_39c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar2) {
    testing::Message::Message(&local_3a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x102,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::Message::~Message(&local_3a8);
  }
  gtest_ar_17.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_17.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  if (gtest_ar_17.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_3d0 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar_16.message_);
    local_3d8 = &s.storage_.data_;
    testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
              ((EqHelper *)local_3c8,"s.data ()","&arr[0]",&local_3d0,(int **)&local_3d8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
    if (!bVar2) {
      testing::Message::Message(&local_3e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x103,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_3e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
      testing::Message::~Message(&local_3e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
    peVar4 = pstore::gsl::span<int,_-1L>::operator[]((span<int,__1L> *)&gtest_ar_16.message_,0);
    local_3fc = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_3f8,"s[0]","1",peVar4,&local_3fc);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
    if (!bVar2) {
      testing::Message::Message(&local_408);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x104,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_408);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
      testing::Message::~Message(&local_408);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
    peVar4 = pstore::gsl::span<int,_-1L>::operator[]((span<int,__1L> *)&gtest_ar_16.message_,1);
    local_424 = 2;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_420,"s[1]","2",peVar4,&local_424);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar2) {
      testing::Message::Message(&local_430);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&s_7.storage_.data_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x105,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&s_7.storage_.data_,&local_430);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_7.storage_.data_);
      testing::Message::~Message(&local_430);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
    ppeVar1 = &s.storage_.data_;
    join_0x00000010_0x00000000_ =
         (storage_type<pstore::gsl::details::extent_type<_1L>_>)
         pstore::gsl::make_span<int>((int *)ppeVar1,(int *)ppeVar1);
    local_460 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar_20.message_);
    local_464 = 0;
    testing::internal::EqHelper::Compare<long,_int,_nullptr>
              ((EqHelper *)local_458,"s.length ()","0",&local_460,&local_464);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
    if (!bVar2) {
      testing::Message::Message(&local_470);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x109,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_470);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
      testing::Message::~Message(&local_470);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
    local_490 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar_20.message_);
    local_498 = &s.storage_.data_;
    testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
              ((EqHelper *)local_488,"s.data ()","&arr[0]",&local_490,(int **)&local_498);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
    if (!bVar2) {
      testing::Message::Message(&local_4a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&p_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x10a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&p_2,&local_4a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p_2);
      testing::Message::~Message(&local_4a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
    join_0x00000010_0x00000000_ =
         (storage_type<pstore::gsl::details::extent_type<_1L>_>)
         pstore::gsl::make_span<int>((int *)0x0,(int *)0x0);
    local_4d8 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar_22.message_);
    local_4dc = 0;
    testing::internal::EqHelper::Compare<long,_int,_nullptr>
              ((EqHelper *)local_4d0,"s.length ()","0",&local_4d8,&local_4dc);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
    if (!bVar2) {
      testing::Message::Message(&local_4e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x110,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_4e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
      testing::Message::~Message(&local_4e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
    local_508 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar_22.message_);
    local_510 = (void *)0x0;
    testing::internal::EqHelper::Compare<int_*,_std::nullptr_t,_nullptr>
              ((EqHelper *)local_500,"s.data ()","nullptr",&local_508,&local_510);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
    if (!bVar2) {
      testing::Message::Message(&local_518);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
      testing::internal::AssertHelper::AssertHelper
                (&local_520,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x111,pcVar3);
      testing::internal::AssertHelper::operator=(&local_520,&local_518);
      testing::internal::AssertHelper::~AssertHelper(&local_520);
      testing::Message::~Message(&local_518);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  }
  return;
}

Assistant:

TEST (GslSpan, FromPointerPointerConstructor) {
    int arr[4] = {1, 2, 3, 4};

    {
        span<int> s{&arr[0], &arr[2]};
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        span<int, 2> s{&arr[0], &arr[2]};
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        span<int> s{&arr[0], &arr[0]};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), &arr[0]);
    }
    {
        span<int, 0> s{&arr[0], &arr[0]};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), &arr[0]);
    }

    {
        int * p = nullptr;
        span<int> s{p, p};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }
    {
        int * p = nullptr;
        span<int, 0> s{p, p};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }

    {
        auto s = make_span (&arr[0], &arr[2]);
        ASSERT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        auto s = make_span (&arr[0], &arr[0]);
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), &arr[0]);
    }

    {
        int * p = nullptr;
        auto s = make_span (p, p);
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }
}